

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

void __thiscall
AixLog::SinkFormat::do_log(SinkFormat *this,ostream *stream,Metadata *metadata,string *message)

{
  pointer pcVar1;
  Function *pFVar2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  Severity logSeverity;
  Severity logSeverity_00;
  string result;
  stringstream ss;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [7];
  ios_base local_148 [264];
  TextColor local_40;
  TextColor local_38;
  
  pcVar1 = (this->format_)._M_dataplus._M_p;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar1,pcVar1 + (this->format_)._M_string_length);
  if ((metadata->timestamp).is_null_ == false) {
    Timestamp::to_string((string *)local_1c8,&metadata->timestamp,&local_208);
    std::__cxx11::string::operator=((string *)&local_208,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
    }
  }
  uVar3 = std::__cxx11::string::find((char *)&local_208,0x1b955b,0);
  if (uVar3 != 0xffffffffffffffff) {
    to_string_abi_cxx11_
              ((string *)local_1c8,(AixLog *)(ulong)(uint)(int)(char)metadata->severity,logSeverity)
    ;
    std::__cxx11::string::replace((ulong)&local_208,uVar3,(char *)0x9,local_1c8._0_8_);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
    }
  }
  uVar3 = std::__cxx11::string::find((char *)&local_208,0x1b9565,0);
  if (uVar3 != 0xffffffffffffffff) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
    local_38.foreground = RED;
    local_38.background = NONE;
    AixLog::operator<<((ostream *)(local_1c8 + 0x10),&local_38);
    to_string_abi_cxx11_
              (&local_1e8,(AixLog *)(ulong)(uint)(int)(char)metadata->severity,logSeverity_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1c8 + 0x10),local_1e8._M_dataplus._M_p,
                        local_1e8._M_string_length);
    local_40.foreground = NONE;
    local_40.background = NONE;
    AixLog::operator<<(poVar4,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace
              ((ulong)&local_208,uVar3,(char *)0xf,(ulong)local_1e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
    std::ios_base::~ios_base(local_148);
  }
  uVar3 = std::__cxx11::string::find((char *)&local_208,0x1b9575,0);
  if (uVar3 == 0xffffffffffffffff) goto LAB_0014824e;
  if ((metadata->tag).is_null_ == false) {
    pFVar2 = (Function *)&metadata->tag;
    lVar5 = 0x18;
LAB_001481fd:
    local_1c8._0_8_ = local_1c8 + 0x10;
    pcVar1 = (pFVar2->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,pcVar1,pcVar1 + *(long *)(&metadata->severity + lVar5));
  }
  else {
    if ((metadata->function).is_null_ == false) {
      pFVar2 = &metadata->function;
      lVar5 = 0x48;
      goto LAB_001481fd;
    }
    local_1c8._0_8_ = local_1c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"log","");
  }
  std::__cxx11::string::replace((ulong)&local_208,uVar3,(char *)0x9,local_1c8._0_8_);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
  }
LAB_0014824e:
  uVar3 = std::__cxx11::string::find((char *)&local_208,0x1b957f,0);
  if (uVar3 != 0xffffffffffffffff) {
    if ((metadata->tag).is_null_ == false) {
      local_1c8._0_8_ = local_1c8 + 0x10;
      pcVar1 = (metadata->tag).text._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,pcVar1,pcVar1 + (metadata->tag).text._M_string_length);
    }
    else {
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
    }
    std::__cxx11::string::replace((ulong)&local_208,uVar3,(char *)0x4,local_1c8._0_8_);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
    }
  }
  uVar3 = std::__cxx11::string::find((char *)&local_208,0x1b9584,0);
  if (uVar3 != 0xffffffffffffffff) {
    if ((metadata->function).is_null_ == false) {
      local_1c8._0_8_ = local_1c8 + 0x10;
      pcVar1 = (metadata->function).name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,pcVar1,pcVar1 + (metadata->function).name._M_string_length);
    }
    else {
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
    }
    std::__cxx11::string::replace((ulong)&local_208,uVar3,(char *)0x9,local_1c8._0_8_);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
    }
  }
  uVar3 = std::__cxx11::string::find((char *)&local_208,0x1b958e,0);
  if (uVar3 == 0xffffffffffffffff) {
    if ((local_208._M_string_length == 0) ||
       (local_208._M_dataplus._M_p[local_208._M_string_length - 1] == ' ')) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_208._M_dataplus._M_p,local_208._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(message->_M_dataplus)._M_p,message->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_208._M_dataplus._M_p,local_208._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(message->_M_dataplus)._M_p,message->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
  }
  else {
    std::__cxx11::string::replace
              ((ulong)&local_208,uVar3,&DAT_00000008,(ulong)(message->_M_dataplus)._M_p);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void do_log(std::ostream& stream, const Metadata& metadata,
                      const std::string& message) const {
    std::string result = format_;
    if (metadata.timestamp) result = metadata.timestamp.to_string(result);

    size_t pos = result.find("#severity");
    if (pos != std::string::npos)
      result.replace(pos, 9, to_string(metadata.severity));

    pos = result.find("#color_severity");
    if (pos != std::string::npos) {
      std::stringstream ss;
      ss << TextColor(Color::RED) << to_string(metadata.severity)
         << TextColor(Color::NONE);
      result.replace(pos, 15, ss.str());
    }

    pos = result.find("#tag_func");
    if (pos != std::string::npos)
      result.replace(
          pos, 9,
          metadata.tag ? metadata.tag.text
                       : (metadata.function ? metadata.function.name : "log"));

    pos = result.find("#tag");
    if (pos != std::string::npos)
      result.replace(pos, 4, metadata.tag ? metadata.tag.text : "");

    pos = result.find("#function");
    if (pos != std::string::npos)
      result.replace(pos, 9, metadata.function ? metadata.function.name : "");

    pos = result.find("#message");
    if (pos != std::string::npos) {
      result.replace(pos, 8, message);
      stream << result << std::endl;
    } else {
      if (result.empty() || (result.back() == ' '))
        stream << result << message << std::endl;
      else
        stream << result << " " << message << std::endl;
    }
  }